

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O2

int dlep_writer_add_status(dlep_writer *writer,dlep_status status,char *text)

{
  int iVar1;
  size_t sVar2;
  uint8_t value;
  
  sVar2 = strlen(text);
  if (sVar2 < 0xffff) {
    dlep_writer_add_tlv2(writer,1,&value,1,text,(uint16_t)sVar2);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
dlep_writer_add_status(struct dlep_writer *writer, enum dlep_status status, const char *text) {
  uint8_t value;
  size_t txtlen;

  value = status;
  txtlen = strlen(text);
  if (txtlen > 65534) {
    return -1;
  }

  dlep_writer_add_tlv2(writer, DLEP_STATUS_TLV, &value, sizeof(value), text, txtlen);
  return 0;
}